

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O1

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<double>_>::writeErrorBars
          (AccumulatorView<OpenMD::Utils::Accumulator<double>_> *this,ostream *stream,
          string *errorMessage,ErrorHandling errorHandling)

{
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  
  sVar2 = (this->super_RealAccumulator).Count_;
  if (errorHandling == Variance) {
    dVar3 = (this->super_RealAccumulator).Avg_;
    dVar4 = (this->super_RealAccumulator).Avg2_ - dVar3 * dVar3;
    dVar3 = 0.0;
    if (0.0 <= dVar4) {
      dVar3 = dVar4;
    }
  }
  else if (errorHandling == StdDev) {
    dVar3 = (this->super_RealAccumulator).Avg_;
    dVar4 = (this->super_RealAccumulator).Avg2_ - dVar3 * dVar3;
    dVar3 = 0.0;
    if (0.0 <= dVar4) {
      dVar3 = dVar4;
    }
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
  }
  else {
    dVar3 = 0.0;
    if (errorHandling == CI95) {
      dVar3 = (this->super_RealAccumulator).Avg_;
      dVar4 = (this->super_RealAccumulator).Avg2_ - dVar3 * dVar3;
      dVar3 = 0.0;
      if (0.0 <= dVar4) {
        dVar3 = dVar4;
      }
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      sVar1 = (this->super_RealAccumulator).Count_;
      dVar4 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar3 = (dVar3 * 1.96) / dVar4;
    }
  }
  if (errorHandling == CI95 && sVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    return;
  }
  if (0x7fefffffffffffff < (ulong)ABS(dVar3)) {
    snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
  if (sVar2 == 0) {
    return;
  }
  std::ostream::_M_insert<double>(dVar3);
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      RealType err {};
      std::size_t count = RealAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = RealAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = RealAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = RealAccumulator::getVariance();
        break;
      default:
        break;
      }

      if (count == 0 && errorHandling == ErrorHandling::CI95) {
        stream << "\t";
      } else {
        if (std::isinf(err) || std::isnan(err)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << err;
        }
      }
    }